

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_bool spvc_compiler_msl_is_rasterization_disabled(spvc_compiler compiler)

{
  spvc_context_s *this;
  CompilerMSL *this_00;
  CompilerMSL *msl;
  allocator local_39;
  string local_38;
  spvc_compiler local_18;
  spvc_compiler compiler_local;
  
  local_18 = compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    this_00 = (CompilerMSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    compiler_local._7_1_ = spirv_cross::CompilerMSL::get_is_rasterization_disabled(this_00);
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"MSL function used on a non-MSL backend.",&local_39);
    spvc_context_s::report_error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    compiler_local._7_1_ = false;
  }
  return compiler_local._7_1_;
}

Assistant:

spvc_bool spvc_compiler_msl_is_rasterization_disabled(spvc_compiler compiler)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_FALSE;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	return msl.get_is_rasterization_disabled() ? SPVC_TRUE : SPVC_FALSE;
#else
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_FALSE;
#endif
}